

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Appearance_PDU::Appearance_PDU(Appearance_PDU *this,LE_EntityIdentifier *ID)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  
  LE_Header::LE_Header(&this->super_LE_Header);
  (this->super_LE_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Appearance_PDU_00334860;
  DATA_TYPE::EntityType::EntityType(&this->m_EntityType);
  DATA_TYPE::EntityType::EntityType(&this->m_AltEntityType);
  DATA_TYPE::EntityMarking::EntityMarking(&this->m_EntityMarking);
  DATA_TYPE::EntityCapabilities::EntityCapabilities(&this->m_EntityCapabilities);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_VisApp);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_IRApp);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EMApp);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_AudApp);
  KVar1 = ID->m_ui8ApplicationID;
  KVar2 = ID->m_ui16EntityID;
  (this->super_LE_Header).m_EntID.m_ui8SiteID = ID->m_ui8SiteID;
  (this->super_LE_Header).m_EntID.m_ui8ApplicationID = KVar1;
  (this->super_LE_Header).m_EntID.m_ui16EntityID = KVar2;
  this->m_AppearanceFlag1Union = (anon_union_1_2_647d7bf6_for_m_AppearanceFlag1Union)0x0;
  this->m_AppearanceFlag2Union = (anon_union_1_2_647d7bf6_for_m_AppearanceFlag2Union)0x0;
  (this->super_LE_Header).super_Header.super_Header6.m_ui8PDUType = '/';
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = 0x11;
  return;
}

Assistant:

Appearance_PDU::Appearance_PDU( const LE_EntityIdentifier & ID )
{
    m_EntID = ID;
    m_AppearanceFlag1Union.m_ui8Flag = 0;
    m_AppearanceFlag2Union.m_ui8Flag = 0;
    m_ui8PDUType = Appearance_PDU_Type;
    m_ui16PDULength = APPEARANCE_PDU_SIZE;
}